

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testutil.h
# Opt level: O2

int test_setsockopt_impl
              (char *file,int line,int sock,int level,int option,void *optval,size_t optlen)

{
  FILE *__stream;
  int iVar1;
  undefined8 in_RAX;
  uint *puVar2;
  char *pcVar3;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000014;
  undefined4 uVar4;
  
  uVar4 = (undefined4)((ulong)in_RAX >> 0x20);
  iVar1 = nn_setsockopt(line,0,CONCAT44(in_register_00000014,sock),
                        CONCAT44(in_register_0000000c,level),4);
  __stream = _stderr;
  if (-1 < iVar1) {
    return iVar1;
  }
  puVar2 = (uint *)__errno_location();
  pcVar3 = nn_err_strerror(*puVar2);
  fprintf(__stream,"Failed set option \"%d\": %s [%d] (%s:%d)\n",(ulong)(uint)sock,pcVar3,
          (ulong)*puVar2,
          "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/surveyttl.c",
          CONCAT44(uVar4,(int)file));
  nn_err_abort();
}

Assistant:

static int NN_UNUSED test_setsockopt_impl (char *file, int line,
    int sock, int level, int option, const void *optval, size_t optlen)
{
    int rc;

    rc = nn_setsockopt (sock, level, option, optval, optlen);
    if(rc < 0) {
        fprintf (stderr, "Failed set option \"%d\": %s [%d] (%s:%d)\n",
            option,
            nn_err_strerror (errno),
            (int) errno, file, line);
        nn_err_abort ();
    }
    return rc;
}